

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

void __thiscall
Jupiter::IRC::Client::Channel::delUserPrefix(Channel *this,string_view in_nickname,char prefix)

{
  size_type __pos;
  string_view in_nickname_00;
  shared_ptr<Jupiter::IRC::Client::Channel::User> user;
  
  in_nickname_00._M_str = (char *)in_nickname._M_len;
  in_nickname_00._M_len = (size_t)this;
  getUser((Channel *)&user,in_nickname_00);
  if (user.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&(user.
                         super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_prefixes,prefix,0);
    if (__pos != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&(user.
                   super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->m_prefixes,__pos,1);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&user.
              super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Jupiter::IRC::Client::Channel::delUserPrefix(std::string_view in_nickname, char prefix) {
	auto user = getUser(in_nickname);

	if (user != nullptr) {
		size_t prefix_pos = user->m_prefixes.find(prefix);
		if (prefix_pos != std::string::npos) {
			user->m_prefixes.erase(prefix_pos, 1);
		}
	}
}